

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::validate(Arg *this)

{
  logic_error *this_00;
  bool bVar1;
  undefined1 local_50 [72];
  Arg *this_local;
  
  local_50._64_8_ = this;
  bVar1 = Detail::BoundArgFunction<Catch::ConfigData>::takesArg(&this->boundField);
  if ((bVar1) && (bVar1 = takesArg(this), !bVar1)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    dbgName_abi_cxx11_((Arg *)local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_50 + 0x20),local_50);
    std::logic_error::logic_error(this_00,(string *)(local_50 + 0x20));
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void validate() const {
                if( boundField.takesArg() && !takesArg() )
                    throw std::logic_error( dbgName() + " must specify an arg name" );
            }